

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

bool __thiscall Minisat::SimpSolver::implied(SimpSolver *this,vec<Minisat::Lit> *c)

{
  bool bVar1;
  int iVar2;
  CRef CVar3;
  Lit *pLVar4;
  vec<Minisat::Lit> *in_RSI;
  vec<int> *in_RDI;
  byte bVar5;
  bool result;
  CRef in_stack_00000020;
  int in_stack_00000024;
  Solver *in_stack_00000028;
  Lit in_stack_00000034;
  int i;
  Solver *in_stack_00000050;
  Solver *in_stack_00000200;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int iVar6;
  Solver *this_00;
  Lit in_stack_ffffffffffffffc0;
  lbool local_31;
  int local_30;
  uint8_t local_2a;
  lbool local_29;
  int local_28;
  lbool local_21;
  int local_20;
  int local_1c;
  vec<Minisat::Lit> *local_18;
  
  this_00 = (Solver *)(in_RDI + 0x36);
  local_18 = in_RSI;
  local_1c = vec<Minisat::Lit>::size((vec<Minisat::Lit> *)(in_RDI + 0x35));
  vec<int>::push(in_RDI,(int *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  local_20 = 0;
  while( true ) {
    iVar6 = local_20;
    iVar2 = vec<Minisat::Lit>::size(local_18);
    if (iVar2 <= iVar6) {
      CVar3 = Solver::propagate(in_stack_00000200);
      bVar5 = CVar3 != 0xffffffff;
      Solver::cancelUntil(in_stack_00000050,this._4_4_,this._3_1_);
      return (bool)(bVar5 & 1);
    }
    pLVar4 = vec<Minisat::Lit>::operator[](local_18,local_20);
    local_28 = pLVar4->x;
    local_21 = Solver::value(this_00,in_stack_ffffffffffffffc0);
    lbool::lbool(&local_29,'\0');
    bVar1 = lbool::operator==(&local_21,local_29);
    if (bVar1) break;
    pLVar4 = vec<Minisat::Lit>::operator[](local_18,local_20);
    local_30 = pLVar4->x;
    local_2a = (uint8_t)Solver::value(this_00,in_stack_ffffffffffffffc0);
    lbool::lbool(&local_31,'\x01');
    bVar1 = lbool::operator!=((lbool *)CONCAT44(iVar6,in_stack_ffffffffffffffa8),
                              (lbool)(uint8_t)((ulong)in_RDI >> 0x38));
    if (bVar1) {
      pLVar4 = vec<Minisat::Lit>::operator[](local_18,local_20);
      operator~((Lit)pLVar4->x);
      Solver::decisionLevel((Solver *)0x15b911);
      Solver::uncheckedEnqueue
                (in_stack_00000028,in_stack_00000034,in_stack_00000024,in_stack_00000020);
    }
    local_20 = local_20 + 1;
  }
  Solver::cancelUntil(in_stack_00000050,this._4_4_,this._3_1_);
  return true;
}

Assistant:

bool SimpSolver::implied(const vec<Lit> &c)
{
    assert(decisionLevel() == 0);

    trail_lim.push(trail.size());
    for (int i = 0; i < c.size(); i++)
        if (value(c[i]) == l_True) {
            cancelUntil(0);
            return true;
        } else if (value(c[i]) != l_False) {
            assert(value(c[i]) == l_Undef);
            uncheckedEnqueue(~c[i], decisionLevel());
        }

    bool result = propagate() != CRef_Undef;
    cancelUntil(0);
    return result;
}